

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_xfer_recv(Curl_easy *data,char *buf,size_t blen,ssize_t *pnrcvd)

{
  int iVar1;
  CURLcode CVar2;
  ulong uVar3;
  uint sockindex;
  
  iVar1 = data->conn->sockfd;
  sockindex = 0;
  if (iVar1 != -1) {
    sockindex = (uint)(iVar1 == data->conn->sock[1]);
  }
  uVar3 = (ulong)(data->set).buffer_size;
  if (uVar3 < blen) {
    blen = uVar3;
  }
  CVar2 = Curl_conn_recv(data,sockindex,buf,blen,pnrcvd);
  return CVar2;
}

Assistant:

CURLcode Curl_xfer_recv(struct Curl_easy *data,
                        char *buf, size_t blen,
                        ssize_t *pnrcvd)
{
  int sockindex;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  DEBUGASSERT(data->set.buffer_size > 0);

  sockindex = ((data->conn->sockfd != CURL_SOCKET_BAD) &&
               (data->conn->sockfd == data->conn->sock[SECONDARYSOCKET]));
  if((size_t)data->set.buffer_size < blen)
    blen = (size_t)data->set.buffer_size;
  return Curl_conn_recv(data, sockindex, buf, blen, pnrcvd);
}